

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Status json_array_append_null(JSON_Array *array)

{
  JSON_Status JVar1;
  JSON_Value *value_00;
  JSON_Value *value;
  JSON_Array *array_local;
  
  value_00 = json_value_init_null();
  if (value_00 == (JSON_Value *)0x0) {
    array_local._4_4_ = -1;
  }
  else {
    JVar1 = json_array_append_value(array,value_00);
    if (JVar1 == 0) {
      array_local._4_4_ = 0;
    }
    else {
      json_value_free(value_00);
      array_local._4_4_ = -1;
    }
  }
  return array_local._4_4_;
}

Assistant:

JSON_Status json_array_append_null(JSON_Array *array) {
    JSON_Value *value = json_value_init_null();
    if (value == NULL) {
        return JSONFailure;
    }
    if (json_array_append_value(array, value) != JSONSuccess) {
        json_value_free(value);
        return JSONFailure;
    }
    return JSONSuccess;
}